

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O3

void skiwi::compile_ieee754_sqrt(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t header;
  string error;
  string save_flonum;
  string is_fixnum;
  operand local_b0 [4];
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  psVar1 = label;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  label_to_string_abi_cxx11_(&local_40,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar1,lab);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_a0,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_a0._M_dataplus._M_p._0_4_ = 5;
    local_b0[1] = 0x14;
    local_b0[0] = NUMBER;
    local_b0[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_a0,local_b0 + 1,local_b0,(int *)(local_b0 + 2));
    local_a0._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_a0,&local_80);
  }
  local_a0._M_dataplus._M_p._0_4_ = 0x5a;
  local_b0[1] = 0xb;
  local_b0[0] = NUMBER;
  local_b0[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_a0,local_b0 + 1,local_b0,(int *)(local_b0 + 2));
  local_a0._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a0,&local_40);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_is_not_block(code,RCX,R11,&local_80);
  }
  local_b0[1] = 2;
  local_b0[0] = RCX;
  local_b0[2] = 0x39;
  local_a0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_b0 + 1,local_b0,local_b0 + 2,(unsigned_long *)&local_a0);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_flonum(code,RCX,R11,&local_80);
  }
  local_a0._M_dataplus._M_p._0_4_ = 0x41;
  local_b0[1] = 0x43;
  local_b0[0] = MEM_RCX;
  local_b0[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_a0,local_b0 + 1,local_b0,(int *)(local_b0 + 2));
  local_a0._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a0,&local_60);
  local_a0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a0,&local_40);
  local_a0._M_dataplus._M_p._0_4_ = 0x4e;
  local_b0[1] = 0xb;
  local_b0[0] = NUMBER;
  local_b0[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_a0,local_b0 + 1,local_b0,(int *)(local_b0 + 2));
  local_a0._M_dataplus._M_p._0_4_ = 0xb;
  local_b0[1] = 0x43;
  local_b0[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_a0,local_b0 + 1,local_b0);
  local_a0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a0,&local_60);
  local_a0._M_dataplus._M_p._0_4_ = 0x57;
  local_b0[1] = 0x43;
  local_b0[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_a0,local_b0 + 1,local_b0);
  local_a0._M_dataplus._M_p = (pointer)0x100000000000001;
  local_b0[1] = 0x40;
  local_b0[0] = R11;
  local_b0[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_b0 + 1,local_b0,local_b0 + 2);
  local_b0[1] = 0x49;
  local_b0[0] = R11;
  local_b0[2] = 0x39;
  local_b0[3] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_b0 + 1,local_b0,local_b0 + 2,(int *)(local_b0 + 3));
  local_b0[1] = 0x40;
  local_b0[0] = RAX;
  local_b0[2] = 0x39;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,local_b0 + 1,local_b0,local_b0 + 2,(unsigned_long *)&local_a0);
  local_b0[1] = 0x40;
  local_b0[0] = MEM_RBP;
  local_b0[2] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_b0 + 1,local_b0,local_b0 + 2);
  local_b0[1] = 0x41;
  local_b0[0] = MEM_RBP;
  local_b0[2] = 8;
  local_b0[3] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_b0 + 1,local_b0,(int *)(local_b0 + 2),local_b0 + 3);
  local_b0[1] = 0;
  local_b0[0] = RBP;
  local_b0[2] = 0x39;
  local_b0[3] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_b0 + 1,local_b0,local_b0 + 2,(int *)(local_b0 + 3));
  local_b0[1] = 0x40;
  local_b0[0] = RAX;
  local_b0[2] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_b0 + 1,local_b0,local_b0 + 2);
  local_b0[1] = 0x2c;
  local_b0[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_b0 + 1,local_b0);
  if (ops->safe_primitives == true) {
    error_label(code,&local_80,re_ieee754_sqrt_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_ieee754_sqrt(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string is_fixnum = label_to_string(label++);
  std::string save_flonum = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, is_fixnum);
  if (ops.safe_primitives)
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);

  code.add(asmcode::MOVQ, asmcode::XMM0, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::JMPS, save_flonum);
  code.add(asmcode::LABEL, is_fixnum);
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::CVTSI2SD, asmcode::XMM0, asmcode::RCX);
  code.add(asmcode::LABEL, save_flonum);
  code.add(asmcode::SQRTPD, asmcode::XMM0, asmcode::XMM0);
  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(asmcode::MOV, asmcode::R11, ALLOC);
  code.add(asmcode::OR, asmcode::R11, asmcode::NUMBER, block_tag);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM0);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_ieee754_sqrt_contract_violation);
    }
  }